

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::write_preamble
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,Header *header)

{
  undefined1 *puVar1;
  int64_t iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  uint64_t header_size;
  long local_30;
  
  puVar1 = &this->field_0x38;
  lVar7 = std::ostream::tellp();
  if (lVar7 != 0) {
    __assert_fail("stream_.tellp() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                  ,0x100,
                  "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeAggregate>::write_preamble(const HeaderType &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeAggregate]"
                 );
  }
  std::ostream::write(puVar1,0x17d1c8);
  check_stream(this,"write magic bytes");
  std::ostream::write(puVar1,0x17d1d0);
  check_stream(this,"write");
  local_30 = 0x38;
  std::ostream::write(puVar1,(long)&local_30);
  check_stream(this,"write");
  std::ostream::write(puVar1,(long)header);
  check_stream(this,"write");
  (this->data_begin_)._M_off = local_30 + 0x18;
  (this->data_begin_)._M_state.__count = 0;
  (this->data_begin_)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  lVar7 = std::ostream::tellp();
  if (lVar7 == (this->data_begin_)._M_off) {
    std::ostream::flush();
    check_stream(this,"flush");
    size(this);
    iVar2 = header->interval;
    uVar3 = (header->duration_period).num;
    uVar4 = (header->duration_period).den;
    iVar5 = header->interval_min;
    iVar6 = header->interval_factor;
    (this->header_).version = header->version;
    (this->header_).interval = iVar2;
    (this->header_).duration_period.num = uVar3;
    (this->header_).duration_period.den = uVar4;
    (this->header_).interval_min = iVar5;
    (this->header_).interval_factor = iVar6;
    (this->header_).interval_max = header->interval_max;
    return;
  }
  __assert_fail("stream_.tellp() == data_begin_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                ,0x108,
                "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeAggregate>::write_preamble(const HeaderType &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeAggregate]"
               );
}

Assistant:

void write_preamble(const HeaderType& header)
    {
        assert(stream_.tellp() == 0);
        stream_.write(magic_bytes.data(), magic_bytes.size());
        check_stream("write magic bytes");
        write(byte_order_mark);
        uint64_t header_size = sizeof(header);
        write(header_size);
        write(header);
        data_begin_ = header_begin_ + header_size;
        assert(stream_.tellp() == data_begin_);
        flush();
        size();
        header_ = header;
    }